

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

string * libcellml::printMapVariables
                   (string *__return_storage_ptr__,VariablePairPtr *variablePair,IdList *idList,
                   bool autoIds)

{
  element_type *peVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  VariablePairImpl *pVVar7;
  VariablePairImpl *pVVar8;
  VariablePtr *variable2;
  undefined8 uVar9;
  element_type *peVar10;
  _Alloc_hider _Var11;
  string mappingId;
  undefined1 local_118 [32];
  undefined1 local_f8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  string local_d8;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  VariablePair local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  VariablePair local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  VariablePair::variable1(&local_60);
  NamedEntity::name_abi_cxx11_(&local_50,(NamedEntity *)local_60.mPimpl);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2a742a);
  paVar2 = &local_b8.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8.field_2._8_8_ = plVar4[3];
    local_b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_118._0_8_ = local_118 + 0x10;
  pVVar7 = (VariablePairImpl *)(plVar4 + 2);
  if ((VariablePairImpl *)*plVar4 == pVVar7) {
    local_118._16_8_ =
         (pVVar7->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_118._24_8_ = plVar4[3];
  }
  else {
    local_118._16_8_ =
         (pVVar7->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_118._0_8_ = (VariablePairImpl *)*plVar4;
  }
  local_118._8_8_ = plVar4[1];
  *plVar4 = (long)pVVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_118);
  pVVar7 = (VariablePairImpl *)(local_f8 + 0x10);
  pVVar8 = (VariablePairImpl *)(plVar4 + 2);
  if ((VariablePairImpl *)*plVar4 == pVVar8) {
    local_f8._16_8_ =
         (pVVar8->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[3];
    local_f8._0_8_ = pVVar7;
  }
  else {
    local_f8._16_8_ =
         (pVVar8->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_f8._0_8_ = (VariablePairImpl *)*plVar4;
  }
  local_f8._8_8_ = plVar4[1];
  *plVar4 = (long)pVVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  VariablePair::variable2(&local_70);
  NamedEntity::name_abi_cxx11_(&local_90,(NamedEntity *)local_70.mPimpl);
  peVar1 = (element_type *)((long)(_func_int ***)local_f8._8_8_ + local_90._M_string_length);
  peVar10 = (element_type *)0xf;
  if ((VariablePairImpl *)local_f8._0_8_ != pVVar7) {
    peVar10 = (element_type *)local_f8._16_8_;
  }
  if (peVar10 < peVar1) {
    uVar9 = (element_type *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar9 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < peVar1) goto LAB_0024835d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,local_f8._0_8_);
  }
  else {
LAB_0024835d:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append(local_f8,(ulong)local_90._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar6 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_d8._M_string_length = puVar5[1];
  *puVar5 = psVar6;
  puVar5[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  variable2 = (VariablePtr *)(plVar4 + 2);
  if ((VariablePtr *)*plVar4 == variable2) {
    lVar3 = plVar4[3];
    local_98->_M_allocated_capacity =
         (size_type)
         (variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         (size_type)
         (variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)variable2;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((VariablePairImpl *)local_f8._0_8_ != pVVar7) {
    operator_delete((void *)local_f8._0_8_,
                    (ulong)((long)&(((NamedEntity *)local_f8._16_8_)->super_ParentedEntity).
                                   super_Entity._vptr_Entity + 1));
  }
  if ((VariablePairImpl *)local_118._0_8_ != (VariablePairImpl *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  VariablePair::variable1((VariablePair *)local_f8);
  VariablePair::variable2((VariablePair *)local_118);
  Variable::equivalenceMappingId_abi_cxx11_
            (&local_d8,(Variable *)local_f8,(VariablePtr *)local_118,variable2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if (local_d8._M_string_length == 0) {
    if (!autoIds) goto LAB_002486f3;
    makeUniqueId(&local_b8,idList);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2a7454);
    local_118._0_8_ = local_118 + 0x10;
    pVVar7 = (VariablePairImpl *)(plVar4 + 2);
    if ((VariablePairImpl *)*plVar4 == pVVar7) {
      local_118._16_8_ =
           (pVVar7->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_118._24_8_ = plVar4[3];
    }
    else {
      local_118._16_8_ =
           (pVVar7->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_118._0_8_ = (VariablePairImpl *)*plVar4;
    }
    local_118._8_8_ = plVar4[1];
    *plVar4 = (long)pVVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_118);
    pVVar7 = (VariablePairImpl *)(plVar4 + 2);
    if ((VariablePairImpl *)*plVar4 == pVVar7) {
      local_f8._16_8_ =
           (pVVar7->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[3];
      local_f8._0_8_ = (VariablePairImpl *)(local_f8 + 0x10);
    }
    else {
      local_f8._16_8_ =
           (pVVar7->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_f8._0_8_ = (VariablePairImpl *)*plVar4;
    }
    local_f8._8_8_ = plVar4[1];
    *plVar4 = (long)pVVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
    if ((VariablePairImpl *)local_f8._0_8_ != (VariablePairImpl *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)&(((NamedEntity *)local_f8._16_8_)->super_ParentedEntity).
                                     super_Entity._vptr_Entity + 1));
    }
    if ((VariablePairImpl *)local_118._0_8_ != (VariablePairImpl *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    uVar9 = local_b8.field_2._M_allocated_capacity;
    _Var11._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar2) goto LAB_002486f3;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   " id=\"",&local_d8);
    plVar4 = (long *)std::__cxx11::string::append(local_118);
    pVVar8 = (VariablePairImpl *)(plVar4 + 2);
    if ((VariablePairImpl *)*plVar4 == pVVar8) {
      local_f8._16_8_ =
           (pVVar8->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[3];
      local_f8._0_8_ = pVVar7;
    }
    else {
      local_f8._16_8_ =
           (pVVar8->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_f8._0_8_ = (VariablePairImpl *)*plVar4;
    }
    local_f8._8_8_ = plVar4[1];
    *plVar4 = (long)pVVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
    if ((VariablePairImpl *)local_f8._0_8_ != pVVar7) {
      operator_delete((void *)local_f8._0_8_,
                      (ulong)((long)&(((NamedEntity *)local_f8._16_8_)->super_ParentedEntity).
                                     super_Entity._vptr_Entity + 1));
    }
    uVar9 = local_118._16_8_;
    _Var11._M_p = (pointer)local_118._0_8_;
    if ((VariablePairImpl *)local_118._0_8_ == (VariablePairImpl *)(local_118 + 0x10))
    goto LAB_002486f3;
  }
  operator_delete(_Var11._M_p,
                  (ulong)((long)&(((element_type *)uVar9)->super_NamedEntity).super_ParentedEntity.
                                 super_Entity._vptr_Entity + 1));
LAB_002486f3:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string printMapVariables(const VariablePairPtr &variablePair, IdList &idList, bool autoIds)
{
    std::string mapVariables = "<map_variables variable_1=\"" + variablePair->variable1()->name() + "\""
                               + " variable_2=\"" + variablePair->variable2()->name() + "\"";
    std::string mappingId = Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2());
    if (!mappingId.empty()) {
        mapVariables += " id=\"" + mappingId + "\"";
    } else if (autoIds) {
        mapVariables += " id=\"" + makeUniqueId(idList) + "\"";
    }
    mapVariables += "/>";
    return mapVariables;
}